

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  cmLocalGenerator *this_00;
  bool bVar3;
  int iVar4;
  string *psVar5;
  iterator iVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  mapped_type *pmVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer __k;
  pointer puVar10;
  pointer pbVar11;
  bool bVar12;
  undefined8 in_R8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view str;
  string_view source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string cleanScriptRel;
  string cleanScriptAbs;
  cmGeneratedFileStream fout;
  string local_410;
  pointer local_3f0;
  key_type *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  undefined1 local_3c0 [32];
  char *local_3a0;
  undefined8 local_398;
  size_type local_390;
  pointer local_388;
  string *local_380;
  ostream *local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  string local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  size_type local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  char *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  pointer local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  pointer local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  pointer local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [16];
  _Alloc_hider local_1b8;
  _Base_ptr local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  bool local_178;
  
  puVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_378 = os;
  if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == puVar10) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_358,"CMakeFiles/clean_additional.cmake","");
  local_3f0 = puVar10;
  psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((puVar10->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  local_290 = (psVar5->_M_dataplus)._M_p;
  local_298 = (undefined1  [8])psVar5->_M_string_length;
  local_288._M_allocated_capacity = 0;
  local_3c0._16_8_ = local_3c0 + 0x18;
  local_3c0._0_8_ = (char *)0x0;
  local_3c0._8_8_ = &DAT_00000001;
  local_3c0[0x18] = 0x2f;
  local_288._8_8_ = 1;
  local_270 = 0;
  local_268._M_allocated_capacity = local_358._M_string_length;
  local_268._8_8_ = local_358._M_dataplus._M_p;
  local_258._M_allocated_capacity = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_298;
  local_278._M_p = (pointer)local_3c0._16_8_;
  cmCatViews(&local_2f8,views);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_370,
             (cmMakefile *)
             (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  pbVar11 = local_370.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_003eb38e:
    cmsys::SystemTools::RemoveFile(&local_2f8);
  }
  else {
    p_Var1 = &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
    bVar12 = true;
    __k = local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
              ::find(&(this->Configs)._M_t,__k);
      if (((_Rb_tree_header *)iVar6._M_node == p_Var1) ||
         (iVar6._M_node[3]._M_parent == (_Base_ptr)0x0)) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        bVar12 = false;
      }
    } while ((!bVar3) && (__k = __k + 1, __k != pbVar11));
    if (bVar12) goto LAB_003eb38e;
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_2f8,false,None);
    puVar10 = local_3f0;
    if ((*(byte *)((long)&local_278._M_p + *(long *)((long)local_298 + -0x18)) & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,
                 "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n",0x3e);
      local_3e8 = local_370.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar11 = local_370.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                  ::find(&(this->Configs)._M_t,pbVar11);
          if (((_Rb_tree_header *)iVar6._M_node != p_Var1) &&
             (iVar6._M_node[3]._M_parent != (_Base_ptr)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,
                       "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \"",0x35);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_298,(pbVar11->_M_dataplus)._M_p,
                                pbVar11->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"  file(REMOVE_RECURSE\n",0x16);
            for (p_Var8 = iVar6._M_node[2]._M_right;
                p_Var8 != (_Rb_tree_node_base *)&iVar6._M_node[2]._M_parent;
                p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  ",2);
              psVar5 = ConvertToNinjaPath(this,(string *)(p_Var8 + 1));
              str._M_str = (char *)0x0;
              str._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
              cmOutputConverter::EscapeForCMake_abi_cxx11_
                        ((string *)local_3c0,(cmOutputConverter *)psVar5->_M_string_length,str,
                         (WrapQuotes)in_R8);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_298,(char *)local_3c0._0_8_,local_3c0._8_8_);
              local_410._M_dataplus._M_p._0_1_ = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_410,1);
              if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n",4);
            puVar10 = local_3f0;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"endif()\n",8);
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != local_3e8);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&((puVar10->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile->
                   OutputFiles,&local_2f8);
      local_318._M_allocated_capacity = (size_type)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"CLEAN_ADDITIONAL","");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_allocated_capacity == &local_308) {
        local_288._8_8_ = local_308._8_8_;
        local_298 = (undefined1  [8])&local_288;
      }
      else {
        local_298 = (undefined1  [8])local_318._M_allocated_capacity;
      }
      local_288._M_allocated_capacity = (ulong)(uint7)local_308._M_allocated_capacity._1_7_ << 8;
      local_290 = (char *)local_318._8_8_;
      local_318._8_8_ = (char *)0x0;
      local_308._M_local_buf[0] = '\0';
      local_270 = 0;
      local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
      local_258._M_allocated_capacity = (size_type)&local_248;
      local_258._8_8_ = (char *)0x0;
      local_248._M_local_buf[0] = '\0';
      local_238._M_p = (pointer)&local_228;
      local_230 = (pointer)0x0;
      local_228._M_local_buf[0] = '\0';
      local_218._M_p = (pointer)&local_208;
      local_210 = (pointer)0x0;
      local_208._M_local_buf[0] = '\0';
      local_1f8._M_p = (pointer)&local_1e8;
      local_1f0 = (pointer)0x0;
      local_1e8._M_local_buf[0] = '\0';
      local_1d8._M_p = local_1c8;
      local_1d0 = (pointer)0x0;
      local_1c8[0] = '\0';
      local_1b8._M_p = (pointer)&local_1a8;
      local_1b0 = (_Base_ptr)0x0;
      local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
      local_190 = 0;
      local_188._M_local_buf[0] = '\0';
      local_178 = false;
      local_318._M_allocated_capacity = (size_type)&local_308;
      local_278._M_p = (pointer)&local_268;
      local_198._M_p = (pointer)&local_188;
      CMakeCmd_abi_cxx11_((string *)&local_3e0,this);
      this_00 = (local_3f0->_M_t).
                super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t
                .super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      NinjaOutputPath(&local_2d8,this,&local_358);
      source._M_str = local_2d8._M_dataplus._M_p;
      source._M_len = local_2d8._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_2b8,&this_00->super_cmOutputConverter,source,SHELL,false);
      local_3c0._0_8_ = local_3e0._8_8_;
      local_3c0._8_8_ = local_3e0._M_allocated_capacity;
      local_3c0._24_8_ = 0x15;
      local_3a0 = " -DCONFIG=$CONFIG -P ";
      local_398 = 0;
      local_390 = local_2b8._M_string_length;
      local_388 = local_2b8._M_dataplus._M_p;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_3c0;
      local_3c0._16_8_ = &local_3e0;
      local_380 = &local_2b8;
      cmCatViews(&local_410,views_00);
      std::__cxx11::string::operator=((string *)&local_278,(string *)&local_410);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_allocated_capacity != &local_3d0) {
        operator_delete((void *)local_3e0._M_allocated_capacity,local_3d0._M_allocated_capacity + 1)
        ;
      }
      std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)local_258._8_8_,0x85de05);
      std::__cxx11::string::_M_replace((ulong)&local_238,0,(char *)local_230,0x85de22);
      WriteRule((ostream *)
                (this->RulesFileStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                (cmNinjaRule *)local_298);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_298);
      local_338 = &local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"CLEAN_ADDITIONAL","");
      local_290 = (char *)0x0;
      local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
      if (local_338 == &local_328) {
        local_268._8_8_ = local_328._8_8_;
        local_278._M_p = (pointer)&local_268;
      }
      else {
        local_278._M_p = (pointer)local_338;
      }
      local_268._M_allocated_capacity._1_7_ = local_328._M_allocated_capacity._1_7_;
      local_268._M_local_buf[0] = local_328._M_local_buf[0];
      local_270 = local_330;
      local_330 = 0;
      local_328._M_local_buf[0] = '\0';
      local_1c8._8_4_ = 0;
      local_1b8._M_p = (pointer)0x0;
      local_338 = &local_328;
      local_298 = (undefined1  [8])&local_288;
      memset(&local_258,0,0x90);
      local_1a8._8_8_ = 0;
      local_190 = 0;
      local_188._M_local_buf[0] = '\0';
      local_1b0 = (_Base_ptr)(local_1c8 + 8);
      local_1a8._M_allocated_capacity = (size_type)(_Base_ptr)(local_1c8 + 8);
      local_198._M_p = (pointer)&local_188;
      std::__cxx11::string::_M_replace((ulong)local_298,0,local_290,0x85de46);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_258);
      local_3e8 = local_370.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar11 = local_370.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_3e0._M_allocated_capacity = (size_type)&local_3d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3e0,"CMakeFiles/clean.additional","");
          NinjaOutputPath(&local_410,this,(string *)&local_3e0);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x4c])((key_type *)local_3c0,this,&local_410);
          std::__cxx11::string::operator=
                    ((string *)local_258._M_allocated_capacity,(string *)local_3c0);
          if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
            operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_allocated_capacity != &local_3d0) {
            operator_delete((void *)local_3e0._M_allocated_capacity,
                            local_3d0._M_allocated_capacity + 1);
          }
          local_3c0._0_8_ = local_3c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"CONFIG","");
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_1c8,(key_type *)local_3c0);
          std::__cxx11::string::_M_assign((string *)pmVar9);
          if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
            operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
          }
          WriteBuild(this,local_378,(cmNinjaBuild *)local_298,0,(bool *)0x0);
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != local_3e8);
      }
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x28])(this);
      if ((char)iVar4 != '\0') {
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_410,"CMakeFiles/clean.additional","");
        NinjaOutputPath((string *)local_3c0,this,&local_410);
        std::__cxx11::string::operator=
                  ((string *)local_258._M_allocated_capacity,(string *)local_3c0);
        pcVar2 = local_3c0 + 0x10;
        if ((char *)local_3c0._0_8_ != pcVar2) {
          operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        local_3c0._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"CONFIG","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_1c8,(key_type *)local_3c0);
        std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x8a6a45);
        if ((char *)local_3c0._0_8_ != pcVar2) {
          operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
        }
        WriteBuild(this,local_378,(cmNinjaBuild *)local_298,0,(bool *)0x0);
      }
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_298);
      bVar12 = true;
      goto LAB_003eb3e0;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  }
  bVar12 = false;
LAB_003eb3e0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  return bVar12;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  const auto& lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs =
    cmStrCat(lgr->GetBinaryDirectory(), '/', cleanScriptRel);
  std::vector<std::string> configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Check if there are additional files to clean
  bool empty = true;
  for (auto const& config : configs) {
    auto const it = this->Configs.find(config);
    if (it != this->Configs.end() &&
        !it->second.AdditionalCleanFiles.empty()) {
      empty = false;
      break;
    }
  }
  if (empty) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n";
    for (auto const& config : configs) {
      auto const it = this->Configs.find(config);
      if (it != this->Configs.end() &&
          !it->second.AdditionalCleanFiles.empty()) {
        fout << "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
             << config << "\")\n";
        fout << "  file(REMOVE_RECURSE\n";
        for (std::string const& acf : it->second.AdditionalCleanFiles) {
          fout << "  "
               << cmOutputConverter::EscapeForCMake(
                    this->ConvertToNinjaPath(acf))
               << '\n';
        }
        fout << "  )\n";
        fout << "endif()\n";
      }
    }
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = cmStrCat(
      this->CMakeCmd(), " -DCONFIG=$CONFIG -P ",
      lgr->ConvertToOutputFormat(this->NinjaOutputPath(cleanScriptRel),
                                 cmOutputConverter::SHELL));
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.emplace_back();
    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()), config);
      build.Variables["CONFIG"] = config;
      this->WriteBuild(os, build);
    }
    if (this->IsMultiConfig()) {
      build.Outputs.front() =
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName());
      build.Variables["CONFIG"] = "";
      this->WriteBuild(os, build);
    }
  }
  // Return success
  return true;
}